

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transwarp.h
# Opt level: O2

void __thiscall
transwarp::value_task<std::vector<BamTools::RefData,std::allocator<BamTools::RefData>>>::
value_task<std::vector<BamTools::RefData,std::allocator<BamTools::RefData>>&>
          (value_task<std::vector<BamTools::RefData,std::allocator<BamTools::RefData>>> *this,
          bool has_name,string *name,
          vector<BamTools::RefData,_std::allocator<BamTools::RefData>_> *value)

{
  long lVar1;
  node *__p;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__p_00;
  __shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
  local_38;
  
  *(undefined1 (*) [16])(this + 8) = (undefined1  [16])0x0;
  *(undefined ***)this = &PTR__value_task_001fbe18;
  __p = (node *)operator_new(0x80);
  __p->id_ = 0;
  __p->level_ = 0;
  __p->type_ = root;
  (__p->name_).
  super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
       = (__shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
          )0x0;
  (__p->executor_).
  super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
       = (__shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
          )0x0;
  (__p->parents_).
  super__Vector_base<std::shared_ptr<transwarp::node>,_std::allocator<std::shared_ptr<transwarp::node>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__p->parents_).
  super__Vector_base<std::shared_ptr<transwarp::node>,_std::allocator<std::shared_ptr<transwarp::node>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  *(undefined1 (*) [16])
   &(__p->parents_).
    super__Vector_base<std::shared_ptr<transwarp::node>,_std::allocator<std::shared_ptr<transwarp::node>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (undefined1  [16])0x0;
  (__p->custom_data_).super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2> =
       (__shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>)0x0;
  (__p->canceled_)._M_base._M_i = false;
  *(undefined4 *)&(__p->avg_waittime_us_).super___atomic_base<long>._M_i = 0xffffffff;
  *(undefined4 *)((long)&(__p->avg_waittime_us_).super___atomic_base<long>._M_i + 4) = 0xffffffff;
  *(undefined4 *)&(__p->avg_runtime_us_).super___atomic_base<long>._M_i = 0xffffffff;
  *(undefined4 *)((long)&(__p->avg_runtime_us_).super___atomic_base<long>._M_i + 4) = 0xffffffff;
  std::__shared_ptr<transwarp::node,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<transwarp::node,void>
            ((__shared_ptr<transwarp::node,(__gnu_cxx::_Lock_policy)2> *)(this + 0x18),__p);
  detail::
  make_future_with_value<std::vector<BamTools::RefData,std::allocator<BamTools::RefData>>,std::vector<BamTools::RefData,std::allocator<BamTools::RefData>>&>
            ((detail *)(this + 0x28),value);
  this[0x38] = (value_task<std::vector<BamTools::RefData,std::allocator<BamTools::RefData>>>)0x0;
  lVar1 = *(long *)(this + 0x18);
  *(undefined4 *)(lVar1 + 0x10) = 0;
  if (has_name) {
    __p_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)operator_new(0x20)
    ;
    std::__cxx11::string::string((string *)__p_00,(string *)name);
    std::__shared_ptr<std::__cxx11::string,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<std::__cxx11::string,void>
              ((__shared_ptr<std::__cxx11::string,(__gnu_cxx::_Lock_policy)2> *)&local_38,__p_00);
  }
  else {
    local_38._M_ptr = (element_type *)0x0;
    local_38._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  }
  std::
  __shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
  ::operator=((__shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
               *)(lVar1 + 0x18),&local_38);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_38._M_refcount);
  return;
}

Assistant:

value_task(bool has_name, std::string name, T&& value)
    : node_(new transwarp::node),
      future_(transwarp::detail::make_future_with_value<result_type>(std::forward<T>(value)))
    {
        transwarp::detail::node_manip::set_type(*node_, task_type::value);
        transwarp::detail::node_manip::set_name(*node_, (has_name ? std::shared_ptr<std::string>(new std::string(std::move(name))) : nullptr));
    }